

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O2

bool __thiscall
covenant::CycleBreaking<covenant::Sym>::isRLRule
          (CycleBreaking<covenant::Sym> *this,CFG *g,uint lhs,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *rhs,
          set<int,_std::less<int>,_std::allocator<int>_> *scc)

{
  const_iterator Begin;
  Sym *pSVar1;
  pointer pSVar2;
  bool bVar3;
  bool bVar4;
  
  Begin._M_current =
       (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pSVar1 = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar4 = true;
  if (Begin._M_current != pSVar1) {
    bVar3 = allTerminal(this,Begin,pSVar1 + -1,scc);
    if (bVar3) {
      pSVar2 = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pSVar2[-1].x != lhs * 2 + 1) {
        bVar4 = isTerminal(this,pSVar2 + -1,scc);
        return bVar4;
      }
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool isRLRule (const CFG &g, unsigned int lhs, const vector<EdgeSym> &rhs, 
                 const set<int> &scc)
  {
    if (rhs.empty()) 
      return true;
      
    if (allTerminal(rhs.begin(), rhs.end()-1, scc))
    {
      return ((rhs[rhs.size()-1] == EdgeSym::mkVar(lhs)) || 
              isTerminal(rhs[rhs.size()-1],scc));
    }
    else
      return false;
  }